

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureGeometrySeparate::CaptureGeometrySeparate
          (CaptureGeometrySeparate *this,void **vtt,Context *context,char *test_name,
          char *test_description)

{
  char *test_description_local;
  char *test_name_local;
  Context *context_local;
  void **vtt_local;
  CaptureGeometrySeparate *this_local;
  
  CaptureGeometryInterleaved::CaptureGeometryInterleaved
            (&this->super_CaptureGeometryInterleaved,vtt + 1,context,test_name,test_description);
  (this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved = (_func_int **)*vtt;
  *(void **)((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
            (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-3]) =
       vtt[3];
  *(void **)((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
            (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-4]) =
       vtt[4];
  *(undefined8 *)&(this->super_CaptureGeometryInterleaved).field_0x8 = 0;
  *(undefined4 *)&(this->super_CaptureGeometryInterleaved).field_0x10 = 0;
  return;
}

Assistant:

gl3cts::TransformFeedback::CaptureGeometrySeparate::CaptureGeometrySeparate(deqp::Context& context,
																			const char*	test_name,
																			const char*	test_description)
	: CaptureVertexInterleaved(context, test_name, test_description)
	, CaptureVertexSeparate(context, test_name, test_description)
	, CaptureGeometryInterleaved(context, test_name, test_description)
	, m_buffers(DE_NULL)
	, m_max_transform_feedback_separate_attribs(0)
{
}